

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ReadPrimes(char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_9c68;
  int nSize;
  int Temp;
  int j;
  int i;
  int Nums [10000];
  FILE *pFile;
  char *pFileName_local;
  
  local_9c68 = 0;
  Nums._39992_8_ = fopen(pFileName,"rb");
  do {
    iVar3 = local_9c68 + 1;
    iVar1 = __isoc99_fscanf(Nums._39992_8_,"%d",&j + local_9c68);
    local_9c68 = iVar3;
  } while (iVar1 == 1);
  fclose((FILE *)Nums._39992_8_);
  if (iVar3 < 0x400) {
    __assert_fail("nSize >= (1<<10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x14e,"void Iso_ReadPrimes(char *)");
  }
  srand(0x6f);
  for (Temp = 0; Temp < iVar3; Temp = Temp + 1) {
    iVar2 = rand();
    iVar1 = (&j)[Temp];
    (&j)[Temp] = (&j)[iVar2 % iVar3];
    (&j)[iVar2 % iVar3] = iVar1;
  }
  for (Temp = 0; Temp < 0x40; Temp = Temp + 1) {
    printf("    ");
    for (nSize = 0; nSize < 0x10; nSize = nSize + 1) {
      printf("%d,",(ulong)(uint)(&j)[Temp * 0x10 + nSize]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Iso_ReadPrimes( char * pFileName )
{
    FILE * pFile;
    int Nums[10000];
    int i, j, Temp, nSize = 0;
    // read the numbers
    pFile = fopen( pFileName, "rb" );
    while ( fscanf( pFile, "%d", Nums + nSize++ ) == 1 );
    fclose( pFile );
    assert( nSize >= (1<<10) );
    // randomly permute
    srand( 111 );
    for ( i = 0; i < nSize; i++ )
    {
        j = rand() % nSize;
        Temp = Nums[i];
        Nums[i] = Nums[j];
        Nums[j] = Temp;
    }
    // write out
    for ( i = 0; i < 64; i++ )
    {
        printf( "    " );
        for ( j = 0; j < 16; j++ )
            printf( "%d,", Nums[i*16+j] );
        printf( "\n" );
    }
}